

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O3

void __thiscall Saturation::ConsequenceFinder::onClauseInserted(ConsequenceFinder *this,Clause *cl)

{
  uint indexNum;
  uint uVar1;
  ulong n;
  long lVar2;
  
  uVar1 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      indexNum = (cl->_literals[lVar2]->super_Term)._functor;
      n = (ulong)indexNum;
      if ((*(byte *)(*(long *)(*(long *)(DAT_00b521b0 + 0x80) + n * 8) + 0x40) & 0x20) != 0) {
        if ((this->_redundant).super_Array<bool>._capacity <= n) {
          Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
        }
        if ((this->_redundant).super_Array<bool>._array[n] == false) {
          indexClause(this,indexNum,cl,true);
        }
      }
      lVar2 = lVar2 + 1;
    } while ((uint)lVar2 < uVar1);
  }
  return;
}

Assistant:

void ConsequenceFinder::onClauseInserted(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  bool red=false;
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      red=true;
    }
    else {
      indexClause(fn, cl, true);
    }
  }
  if(red) {
    //the clause is already redundant, so we should delete it

    //it may not be the right moment to call this function, so in
    //case of problems just comment this out (it will lead just to
    //some extra work of the algorithm).
    //_sa->removeActiveOrPassiveClause(cl);
  }

}